

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexthtmlparser.cpp
# Opt level: O3

void __thiscall QTextHtmlParser::dumpHtml(QTextHtmlParser *this)

{
  char *pcVar1;
  uint uVar2;
  QTextHtmlParserNode *pQVar3;
  QDebug QVar4;
  uint uVar5;
  ulong uVar6;
  undefined8 *puVar7;
  storage_type *psVar8;
  char16_t *pcVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QLatin1String QVar13;
  QString n;
  QArrayData *local_c0;
  undefined8 *local_b8;
  QString local_a8;
  QArrayData *local_90;
  undefined8 *local_88;
  undefined4 local_78;
  undefined8 local_74;
  undefined8 uStack_6c;
  undefined4 local_64;
  char *local_60;
  QDebug local_58;
  QArrayData *local_50;
  char16_t *local_48;
  qsizetype local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (0 < (int)(this->nodes).d.size) {
    uVar10 = 0;
    do {
      local_78 = 2;
      local_74 = 0;
      uStack_6c = 0;
      local_64 = 0;
      local_60 = "default";
      QMessageLogger::debug();
      (local_58.stream)->space = false;
      if (uVar10 == 0) {
        uVar6 = 0;
      }
      else {
        uVar5 = 0;
        uVar6 = uVar10 & 0xffffffff;
        do {
          uVar2 = (this->nodes).d.ptr[(int)uVar6]->parent;
          uVar6 = (ulong)uVar2;
          uVar5 = uVar5 + 4;
        } while (uVar2 != 0);
        uVar6 = (ulong)uVar5;
      }
      QString::QString(&local_a8,uVar6,(QChar)0x20);
      QString::toLocal8Bit_helper((QChar *)&local_90,(longlong)local_a8.d.ptr);
      QVar4.stream = local_58.stream;
      puVar7 = local_88;
      if (local_88 == (undefined8 *)0x0) {
        puVar7 = &QByteArray::_empty;
      }
      psVar8 = (storage_type *)0xffffffffffffffff;
      do {
        pcVar1 = psVar8 + (long)puVar7 + 1;
        psVar8 = psVar8 + 1;
      } while (*pcVar1 != '\0');
      QVar11.m_data = psVar8;
      QVar11.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar11);
      QTextStream::operator<<(&(QVar4.stream)->ts,(QString *)&local_50);
      if (local_50 != (QArrayData *)0x0) {
        LOCK();
        (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50,2,0x10);
        }
      }
      if ((local_58.stream)->space == true) {
        QTextStream::operator<<(&(local_58.stream)->ts,' ');
      }
      QString::toLocal8Bit_helper
                ((QChar *)&local_c0,(longlong)((this->nodes).d.ptr[uVar10]->tag).d.ptr);
      QVar4.stream = local_58.stream;
      puVar7 = local_b8;
      if (local_b8 == (undefined8 *)0x0) {
        puVar7 = &QByteArray::_empty;
      }
      psVar8 = (storage_type *)0xffffffffffffffff;
      do {
        pcVar1 = psVar8 + (long)puVar7 + 1;
        psVar8 = psVar8 + 1;
      } while (*pcVar1 != '\0');
      QVar12.m_data = psVar8;
      QVar12.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar12);
      QTextStream::operator<<(&(QVar4.stream)->ts,(QString *)&local_50);
      if (local_50 != (QArrayData *)0x0) {
        LOCK();
        (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50,2,0x10);
        }
      }
      if ((local_58.stream)->space == true) {
        QTextStream::operator<<(&(local_58.stream)->ts,' ');
      }
      QTextStream::operator<<(&(local_58.stream)->ts,':');
      if ((local_58.stream)->space == true) {
        QTextStream::operator<<(&(local_58.stream)->ts,' ');
      }
      pQVar3 = (this->nodes).d.ptr[uVar10];
      local_50 = &((pQVar3->text).d.d)->super_QArrayData;
      local_48 = (pQVar3->text).d.ptr;
      local_40 = (pQVar3->text).d.size;
      if (local_50 != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&local_50->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)&local_50->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QVar13.m_data = (char *)0x2;
      QVar13.m_size = 10;
      QString::replace((QChar)(char16_t)&local_50,QVar13,0x6af851);
      pcVar9 = local_48;
      if (local_48 == (char16_t *)0x0) {
        pcVar9 = (char16_t *)&QString::_empty;
      }
      QDebug::putString((QChar *)&local_58,(ulong)pcVar9);
      if ((local_58.stream)->space == true) {
        QTextStream::operator<<(&(local_58.stream)->ts,' ');
      }
      if (local_50 != (QArrayData *)0x0) {
        LOCK();
        (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50,2,0x10);
        }
      }
      if (local_c0 != (QArrayData *)0x0) {
        LOCK();
        (local_c0->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_c0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_c0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_c0,1,0x10);
        }
      }
      if (local_90 != (QArrayData *)0x0) {
        LOCK();
        (local_90->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_90->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_90->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_90,1,0x10);
        }
      }
      if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
        }
      }
      QDebug::~QDebug(&local_58);
      uVar10 = uVar10 + 1;
    } while ((long)uVar10 < (long)(int)(this->nodes).d.size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextHtmlParser::dumpHtml()
{
    for (int i = 0; i < count(); ++i) {
        qDebug().nospace() << qPrintable(QString(depth(i) * 4, u' '))
                           << qPrintable(at(i).tag) << ':'
                           << quoteNewline(at(i).text);
    }
}